

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval.hh
# Opt level: O2

string * __thiscall
tinyusdz::tydra::TerminalAttributeValue::type_name_abi_cxx11_
          (string *__return_storage_ptr__,TerminalAttributeValue *this)

{
  if (this->_empty == true) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_type_name);
  }
  else {
    linb::any::type_name_abi_cxx11_(__return_storage_ptr__,&(this->_value).v_);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string type_name() const {
    if (_empty) {
      return _type_name;
    }

    return _value.type_name();
  }